

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_xml.c
# Opt level: O2

int xml_print_list(lyout *out,int level,lyd_node *node,int is_list,int toplevel,int options)

{
  ly_ctx *ctx;
  lyd_node *node_00;
  int iVar1;
  int iVar2;
  int *piVar3;
  lys_module *plVar4;
  ulong uVar5;
  char *pcVar6;
  lyd_node **pplVar7;
  
  piVar3 = __errno_location();
  *piVar3 = 0;
  if (is_list == 0) {
    xml_print_leaf(out,level,node,toplevel,options);
  }
  else {
    if (toplevel == 0) {
      if ((node->parent == (lyd_node *)0x0) || (iVar1 = nscmp(node,node->parent), iVar1 != 0)) {
        plVar4 = lyd_node_module(node);
        uVar5 = (ulong)(level * 2 - 2);
        if (level == 0) {
          uVar5 = 0;
        }
        ly_print(out,"%*s<%s xmlns=\"%s\"",uVar5,"",node->schema->name,plVar4->ns);
      }
      else {
        uVar5 = (ulong)(level * 2 - 2);
        if (level == 0) {
          uVar5 = 0;
        }
        ly_print(out,"%*s<%s",uVar5,"",node->schema->name);
      }
    }
    else {
      plVar4 = lyd_node_module(node);
      uVar5 = (ulong)(level * 2 - 2);
      if (level == 0) {
        uVar5 = 0;
      }
      ly_print(out,"%*s<%s xmlns=\"%s\"",uVar5,"",node->schema->name,plVar4->ns);
      xml_print_ns(out,node,options);
    }
    iVar1 = xml_print_attrs(out,node,options);
    if (iVar1 != 0) {
      return 1;
    }
    pcVar6 = "\n";
    if (level == 0) {
      pcVar6 = "";
    }
    if (node->child == (lyd_node *)0x0) {
      ly_print(out,"/>%s");
    }
    else {
      pplVar7 = &node->child;
      ly_print(out,">%s");
      iVar1 = level + 1;
      if (level == 0) {
        iVar1 = 0;
      }
      while (node_00 = *pplVar7, node_00 != (lyd_node *)0x0) {
        iVar2 = xml_print_node(out,iVar1,node_00,0,options);
        pplVar7 = &node_00->next;
        if (iVar2 != 0) {
          return 1;
        }
      }
      uVar5 = (ulong)(level * 2 - 2);
      if (level == 0) {
        uVar5 = 0;
      }
      ly_print(out,"%*s</%s>%s",uVar5,"",node->schema->name,pcVar6);
    }
  }
  if (*piVar3 != 0) {
    ctx = node->schema->module->ctx;
    pcVar6 = strerror(*piVar3);
    ly_log(ctx,LY_LLERR,LY_ESYS,"Print error (%s).",pcVar6);
    return 1;
  }
  return 0;
}

Assistant:

static int
xml_print_list(struct lyout *out, int level, const struct lyd_node *node, int is_list, int toplevel, int options)
{
    struct lyd_node *child;
    const char *ns;

    LY_PRINT_SET;

    if (is_list) {
        /* list print */
        if (toplevel || !node->parent || nscmp(node, node->parent)) {
            /* print "namespace" */
            ns = lyd_node_module(node)->ns;
            ly_print(out, "%*s<%s xmlns=\"%s\"", LEVEL, INDENT, node->schema->name, ns);
        } else {
            ly_print(out, "%*s<%s", LEVEL, INDENT, node->schema->name);
        }

        if (toplevel) {
            xml_print_ns(out, node, options);
        }
        if (xml_print_attrs(out, node, options)) {
            return EXIT_FAILURE;
        }

        if (!node->child) {
            ly_print(out, "/>%s", level ? "\n" : "");
            goto finish;
        }
        ly_print(out, ">%s", level ? "\n" : "");

        LY_TREE_FOR(node->child, child) {
            if (xml_print_node(out, level ? level + 1 : 0, child, 0, options)) {
                return EXIT_FAILURE;
            }
        }

        ly_print(out, "%*s</%s>%s", LEVEL, INDENT, node->schema->name, level ? "\n" : "");
    } else {
        /* leaf-list print */
        xml_print_leaf(out, level, node, toplevel, options);
    }

finish:
    LY_PRINT_RET(node->schema->module->ctx);
}